

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseIdentifier(char *in,char *end,Text **id)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  Text *this;
  char *pcVar4;
  size_t numChars;
  
  *id = (Text *)0x0;
  if (in != end && in != (char *)0x0) {
    pcVar4 = end;
    in = lookForNextToken<char>(in,end);
    bVar2 = *in;
    if (9 < (byte)(bVar2 - 0x30)) {
      numChars = 0;
      while( true ) {
        pbVar1 = (byte *)in + numChars;
        bVar3 = isSeparator<char>((ODDLParser *)(ulong)(uint)(int)(char)bVar2,(char)pcVar4);
        if (((pbVar1 == (byte *)end) || (bVar3)) ||
           (((ulong)*pbVar1 < 0x2a && ((0x31000002400U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))))
        break;
        bVar2 = ((byte *)in)[numChars + 1];
        numChars = numChars + 1;
      }
      this = (Text *)operator_new(0x18);
      Text::Text(this,in,numChars);
      *id = this;
      in = (char *)pbVar1;
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseIdentifier( char *in, char *end, Text **id ) {
    *id = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );

    // staring with a number is forbidden
    if( isNumeric<const char>( *in ) ) {
        return in;
    }

    // get size of id
    size_t idLen( 0 );
    char *start( in );
    while( !isSeparator( *in ) && 
            !isNewLine( *in ) && ( in != end ) && 
            *in != Grammar::OpenPropertyToken[ 0 ] &&
            *in != Grammar::ClosePropertyToken[ 0 ] && 
            *in != '$' ) {
        ++in;
        ++idLen;
    }

    const size_t len( idLen );
    *id = new Text( start, len );

    return in;
}